

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

DebuggerScope * __thiscall
Js::FunctionBody::GetDiagCatchScopeObjectAt(FunctionBody *this,int byteCodeOffset)

{
  List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_00
  ;
  DebuggerScope *this_01;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *pTVar4;
  ScopeObjectChain *pSVar5;
  int index;
  
  pSVar5 = (this->m_sourceInfo).pScopeObjectChain.ptr;
  if (pSVar5 != (ScopeObjectChain *)0x0) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    for (index = 0; this_00 = (pSVar5->pScopeChain).ptr,
        index < (this_00->super_ReadOnlyList<Js::DebuggerScope_*,_Memory::Recycler,_DefaultComparer>
                ).count; index = index + 1) {
      pTVar4 = JsUtil::
               List<Js::DebuggerScope_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ::Item(this_00,index);
      this_01 = pTVar4->ptr;
      if (this_01 == (DebuggerScope *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                    ,0x152d,"(debuggerScope)","debuggerScope");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      if ((this_01->scopeType - DiagCatchScopeDirect < 3) &&
         (bVar2 = DebuggerScope::IsOffsetInScope(this_01,byteCodeOffset), bVar2)) {
        return this_01;
      }
      pSVar5 = (this->m_sourceInfo).pScopeObjectChain.ptr;
    }
  }
  return (DebuggerScope *)0x0;
}

Assistant:

Js::DebuggerScope * FunctionBody::GetDiagCatchScopeObjectAt(int byteCodeOffset)
    {
        if (GetScopeObjectChain())
        {
            for (int i = 0; i < GetScopeObjectChain()->pScopeChain->Count(); i++)
            {
                Js::DebuggerScope *debuggerScope = GetScopeObjectChain()->pScopeChain->Item(i);
                Assert(debuggerScope);

                if (debuggerScope->IsCatchScope() && debuggerScope->IsOffsetInScope(byteCodeOffset))
                {
                    return debuggerScope;
                }
            }
        }
        return nullptr;
    }